

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_v_predictor_4x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  int local_dc;
  uint16_t *local_a0;
  int i;
  __m128i above_u16;
  int bd_local;
  uint16_t *left_local;
  uint16_t *above_local;
  ptrdiff_t stride_local;
  uint16_t *dst_local;
  
  uVar1 = *(undefined8 *)above;
  local_a0 = dst;
  for (local_dc = 0; local_dc < 2; local_dc = local_dc + 1) {
    *(undefined8 *)local_a0 = uVar1;
    *(undefined8 *)(local_a0 + stride) = uVar1;
    *(undefined8 *)(local_a0 + stride * 2) = uVar1;
    *(undefined8 *)(local_a0 + stride * 3) = uVar1;
    local_a0 = local_a0 + stride * 4;
  }
  return;
}

Assistant:

void aom_highbd_v_predictor_4x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  (void)left;
  (void)bd;
  const __m128i above_u16 = _mm_loadl_epi64((const __m128i *)above);
  int i;
  for (i = 0; i < 2; ++i) {
    _mm_storel_epi64((__m128i *)dst, above_u16);
    _mm_storel_epi64((__m128i *)(dst + stride), above_u16);
    _mm_storel_epi64((__m128i *)(dst + 2 * stride), above_u16);
    _mm_storel_epi64((__m128i *)(dst + 3 * stride), above_u16);
    dst += stride << 2;
  }
}